

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O2

int __thiscall
btAlignedObjectArray<BT_QUANTIZED_BVH_NODE>::copy
          (btAlignedObjectArray<BT_QUANTIZED_BVH_NODE> *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  undefined8 uVar1;
  long lVar2;
  long in_RCX;
  int i;
  long lVar3;
  
  lVar2 = (long)(int)dst;
  lVar3 = lVar2 << 4;
  for (; lVar2 < (int)src; lVar2 = lVar2 + 1) {
    uVar1 = ((undefined8 *)(*(long *)(this + 0x10) + lVar3))[1];
    *(undefined8 *)(in_RCX + lVar3) = *(undefined8 *)(*(long *)(this + 0x10) + lVar3);
    ((undefined8 *)(in_RCX + lVar3))[1] = uVar1;
    lVar3 = lVar3 + 0x10;
  }
  return (int)lVar2;
}

Assistant:

SIMD_FORCE_INLINE	void	copy(int start,int end, T* dest) const
		{
			int i;
			for (i=start;i<end;++i)
#ifdef BT_USE_PLACEMENT_NEW
				new (&dest[i]) T(m_data[i]);
#else
				dest[i] = m_data[i];
#endif //BT_USE_PLACEMENT_NEW
		}